

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_format(lua_State *L)

{
  SFormat SVar1;
  ulong uVar2;
  GCstr *pGVar3;
  uint uVar4;
  lua_State *in_RDI;
  bool bVar5;
  GCstr *str;
  int retry;
  SFormat sf;
  FormatState fs;
  SBuf *sb;
  GCstr *fmt;
  int top;
  int arg;
  SBuf *sb_1;
  undefined4 in_stack_fffffffffffffe98;
  SFormat in_stack_fffffffffffffe9c;
  lua_State *in_stack_fffffffffffffea0;
  int narg;
  lua_State *in_stack_fffffffffffffea8;
  TValue *L_00;
  lua_State *in_stack_fffffffffffffeb0;
  lua_State *in_stack_fffffffffffffeb8;
  lua_State *in_stack_fffffffffffffec8;
  SFormat in_stack_fffffffffffffed4;
  lua_State *in_stack_fffffffffffffed8;
  size_t in_stack_ffffffffffffff00;
  GCstr *in_stack_ffffffffffffff08;
  uint uVar6;
  FormatState local_e8;
  lua_State *local_c8;
  GCstr *local_c0;
  int local_b8;
  int local_b4;
  lua_State *local_b0;
  GCstr *local_a8;
  TValue *local_a0;
  
  local_b8 = (int)((long)in_RDI->top - (long)in_RDI->base >> 3);
  uVar6 = 0;
  local_b0 = in_RDI;
  do {
    local_b4 = 1;
    uVar2 = (ulong)(local_b0->glref).ptr32;
    local_c8 = (lua_State *)(uVar2 + 0xe8);
    *(int *)(uVar2 + 0xf4) = (int)local_b0;
    (local_c8->nextgc).gcptr32 = *(uint32_t *)(uVar2 + 0xf0);
    local_c0 = lj_lib_checkstr(in_stack_fffffffffffffeb0,
                               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    local_e8.p = (uint8_t *)(local_c0 + 1);
    local_e8.e = (uint8_t *)((long)&(((GCstr *)local_e8.p)->nextgc).gcptr32 + (ulong)local_c0->len);
    while (SVar1 = lj_strfmt_parse(&local_e8), SVar1 != 0) {
      if (SVar1 == 2) {
        lj_buf_putmem((SBuf *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                      (MSize)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      }
      else {
        if (SVar1 == 1) {
          pGVar3 = lj_str_new((lua_State *)CONCAT44(1,uVar6),(char *)in_stack_ffffffffffffff08,
                              (size_t)local_b0);
          lj_err_callerv(local_b0,LJ_ERR_STRFMT,pGVar3 + 1);
        }
        local_b4 = local_b4 + 1;
        if (local_b8 < local_b4) {
          luaL_argerror(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,(char *)0x1354cf);
        }
        narg = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
        switch(SVar1 & 0xf) {
        case 3:
          lj_lib_checknum(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          lj_strfmt_putfnum_int
                    ((SBuf *)in_stack_fffffffffffffea8,
                     (SFormat)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                     (lua_Number)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          break;
        case 4:
          in_stack_fffffffffffffed8 = local_c8;
          lj_lib_checknum(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          lj_strfmt_putfnum_uint
                    ((SBuf *)in_stack_fffffffffffffeb0,
                     (SFormat)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                     (lua_Number)in_stack_fffffffffffffea0);
          break;
        case 5:
          in_stack_fffffffffffffec8 = local_c8;
          lj_lib_checknum(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          lj_strfmt_putfnum((SBuf *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                            6.26038978961423e-318);
          in_stack_fffffffffffffed4 = SVar1;
          break;
        case 6:
          in_stack_ffffffffffffff08 =
               string_fmt_tostring(in_stack_fffffffffffffea8,narg,(int)in_stack_fffffffffffffea0);
          if (in_stack_ffffffffffffff08 == (GCstr *)0x0) {
            uVar6 = 1;
          }
          else if ((SVar1 & 0x10) == 0) {
            lj_strfmt_putfstr((SBuf *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                              (GCstr *)in_stack_fffffffffffffec8);
          }
          else {
            lj_strfmt_putquoted((SBuf *)in_stack_fffffffffffffeb8,(GCstr *)in_stack_fffffffffffffeb0
                               );
          }
          break;
        case 7:
          in_stack_fffffffffffffeb8 = local_c8;
          lj_lib_checkint(in_stack_fffffffffffffea8,narg);
          lj_strfmt_putfchar((SBuf *)in_stack_fffffffffffffeb8,
                             (SFormat)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                             (int32_t)in_stack_fffffffffffffeb0);
          break;
        case 8:
          in_stack_fffffffffffffeb0 = local_c8;
          lj_obj_ptr((global_State *)(ulong)(local_b0->glref).ptr32,
                     local_b0->base + (long)local_b4 + -1);
          lj_strfmt_putptr((SBuf *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (void *)0x1356a4);
        }
      }
    }
    uVar4 = uVar6 + 1;
    bVar5 = uVar6 != 1;
    uVar6 = uVar4;
    if (bVar5) {
      L_00 = local_b0->top + -1;
      local_a8 = lj_str_new((lua_State *)(ulong)uVar4,(char *)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff00);
      ((GCRef *)&(L_00->u32).lo)->gcptr32 = (uint32_t)local_a8;
      (L_00->field_2).it = 0xfffffffb;
      if (*(uint *)((ulong)(local_b0->glref).ptr32 + 0x54) <=
          *(uint *)((ulong)(local_b0->glref).ptr32 + 0x50)) {
        local_a0 = L_00;
        lj_gc_step((lua_State *)&L_00->field_2);
      }
      return 1;
    }
  } while( true );
}

Assistant:

LJLIB_CF(string_format)		LJLIB_REC(.)
{
  int arg, top = (int)(L->top - L->base);
  GCstr *fmt;
  SBuf *sb;
  FormatState fs;
  SFormat sf;
  int retry = 0;
again:
  arg = 1;
  sb = lj_buf_tmp_(L);
  fmt = lj_lib_checkstr(L, arg);
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    if (sf == STRFMT_LIT) {
      lj_buf_putmem(sb, fs.str, fs.len);
    } else if (sf == STRFMT_ERR) {
      lj_err_callerv(L, LJ_ERR_STRFMT, strdata(lj_str_new(L, fs.str, fs.len)));
    } else {
      if (++arg > top)
	luaL_argerror(L, arg, lj_obj_typename[0]);
      switch (STRFMT_TYPE(sf)) {
      case STRFMT_INT:
	if (tvisint(L->base+arg-1)) {
	  int32_t k = intV(L->base+arg-1);
	  if (sf == STRFMT_INT)
	    lj_strfmt_putint(sb, k);  /* Shortcut for plain %d. */
	  else
	    lj_strfmt_putfxint(sb, sf, k);
	} else {
	  lj_strfmt_putfnum_int(sb, sf, lj_lib_checknum(L, arg));
	}
	break;
      case STRFMT_UINT:
	if (tvisint(L->base+arg-1))
	  lj_strfmt_putfxint(sb, sf, intV(L->base+arg-1));
	else
	  lj_strfmt_putfnum_uint(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_NUM:
	lj_strfmt_putfnum(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_STR: {
	GCstr *str = string_fmt_tostring(L, arg, retry);
	if (str == NULL)
	  retry = 1;
	else if ((sf & STRFMT_T_QUOTED))
	  lj_strfmt_putquoted(sb, str);  /* No formatting. */
	else
	  lj_strfmt_putfstr(sb, sf, str);
	break;
	}
      case STRFMT_CHAR:
	lj_strfmt_putfchar(sb, sf, lj_lib_checkint(L, arg));
	break;
      case STRFMT_PTR:  /* No formatting. */
	lj_strfmt_putptr(sb, lj_obj_ptr(G(L), L->base+arg-1));
	break;
      default:
	lj_assertL(0, "bad string format type");
	break;
      }
    }
  }
  if (retry++ == 1) goto again;
  setstrV(L, L->top-1, lj_buf_str(L, sb));
  lj_gc_check(L);
  return 1;
}